

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_msg.c
# Opt level: O0

_Bool uo_http_req_set_request_line
                (uo_http_req *http_req,uo_http_method method,char *uri,uo_http_ver version)

{
  char cVar1;
  size_t __n;
  char *pcVar2;
  char *__dest;
  char *p;
  size_t uri_len;
  size_t version_str_len;
  char *version_str;
  size_t method_str_len;
  char *method_str;
  uo_http_ver version_local;
  char *uri_local;
  uo_http_method method_local;
  uo_http_req *http_req_local;
  
  if ((*(byte *)&http_req->flags >> 2 & 1) != 1) {
    __assert_fail("http_req->flags.role == UO_HTTP_MSG_ROLE_SEND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_http/src/uo_http_msg.c"
                  ,0x80,
                  "_Bool uo_http_req_set_request_line(uo_http_req *, uo_http_method, const char *, uo_http_ver)"
                 );
  }
  switch(method) {
  case UO_HTTP_GET:
    method_str_len = (size_t)anon_var_dwarf_1d8d;
    version_str = (char *)0x3;
    break;
  case UO_HTTP_HEAD:
    method_str_len = (size_t)anon_var_dwarf_1d97;
    version_str = (char *)0x4;
    break;
  case UO_HTTP_PUT:
    method_str_len = (size_t)anon_var_dwarf_1dad;
    version_str = (char *)0x3;
    break;
  case UO_HTTP_DELETE:
    method_str_len = (size_t)anon_var_dwarf_1db7;
    version_str = (char *)0x6;
    break;
  case UO_HTTP_OPTIONS:
    method_str_len = (size_t)anon_var_dwarf_1dcd;
    version_str = (char *)0x7;
    break;
  case UO_HTTP_TRACE:
    method_str_len = (size_t)anon_var_dwarf_1de3;
    version_str = (char *)0x5;
    break;
  case UO_HTTP_POST:
    method_str_len = (size_t)anon_var_dwarf_1df9;
    version_str = (char *)0x4;
    break;
  case UO_HTTP_CONNECT:
    method_str_len = (size_t)anon_var_dwarf_1e03;
    version_str = (char *)0x7;
    break;
  default:
    return false;
  }
  if (version == UO_HTTP_VER_1_0) {
    version_str_len = (size_t)anon_var_dwarf_1e0d;
    uri_len = 8;
  }
  else if (version == UO_HTTP_VER_1_1) {
    version_str_len = (size_t)anon_var_dwarf_1e23;
    uri_len = 8;
  }
  else {
    if (version != UO_HTTP_VER_2) {
      return false;
    }
    version_str_len = (size_t)anon_var_dwarf_1e2d;
    uri_len = 6;
  }
  cVar1 = *uri;
  if (cVar1 != '\0') {
    __n = strlen(uri);
    pcVar2 = (char *)malloc((size_t)(version_str + uri_len + __n + 5));
    uo_refstack_push(&http_req->refstack,pcVar2,free);
    memcpy(pcVar2,(void *)method_str_len,(size_t)version_str);
    (http_req->field_5).field_0.method_sp_uri = pcVar2;
    __dest = version_str + (long)pcVar2 + 1;
    version_str[(long)pcVar2] = ' ';
    memcpy(__dest,uri,__n);
    (http_req->field_5).field_0.uri = __dest;
    pcVar2 = __dest + __n + 1;
    __dest[__n] = '\0';
    memcpy(pcVar2,(void *)version_str_len,uri_len);
    (http_req->field_5).field_0.version_crlf = pcVar2;
    pcVar2 = pcVar2 + uri_len;
    *pcVar2 = '\r';
    pcVar2[1] = '\n';
    pcVar2[2] = '\0';
    http_req->ver = version;
    (http_req->field_5).field_0.method = method;
    *(byte *)&http_req->flags = *(byte *)&http_req->flags & 0xf7 | 8;
  }
  return cVar1 != '\0';
}

Assistant:

bool uo_http_req_set_request_line(
    uo_http_req *http_req,
    uo_http_method method,
    const char *uri,
    uo_http_ver version)
{
    assert(http_req->flags.role == UO_HTTP_MSG_ROLE_SEND);

    const char *method_str;
    size_t method_str_len;
    switch (method)
    {
        case UO_HTTP_GET:     method_str = "GET";     method_str_len = 3; break;
        case UO_HTTP_HEAD:    method_str = "HEAD";    method_str_len = 4; break;
        case UO_HTTP_PUT:     method_str = "PUT";     method_str_len = 3; break;
        case UO_HTTP_DELETE:  method_str = "DELETE";  method_str_len = 6; break;
        case UO_HTTP_OPTIONS: method_str = "OPTIONS"; method_str_len = 7; break;
        case UO_HTTP_TRACE:   method_str = "TRACE";   method_str_len = 5; break;
        case UO_HTTP_POST:    method_str = "POST";    method_str_len = 4; break;
        case UO_HTTP_CONNECT: method_str = "CONNECT"; method_str_len = 7; break;
        default: return false;
    }

    const char *version_str;
    size_t version_str_len;
    switch (version)
    {
        case UO_HTTP_VER_1_0: version_str = "HTTP/1.0"; version_str_len = 8; break;
        case UO_HTTP_VER_1_1: version_str = "HTTP/1.1"; version_str_len = 8; break;
        case UO_HTTP_VER_2:   version_str = "HTTP/2";   version_str_len = 6; break;
        default: return false;
    }

    if (!*uri)
        return false;

    size_t uri_len = strlen(uri);

    char *p = malloc(method_str_len + uri_len + version_str_len + 5);
    uo_refstack_push(&http_req->refstack, p, free);

    http_req->method_sp_uri = memcpy(p, method_str, method_str_len);
    p += method_str_len;
    *p++ = ' ';

    http_req->uri = memcpy(p, uri, uri_len);
    p += uri_len;
    *p++ = '\0'; // replaced with ' ' before sending the message

    http_req->version_crlf = memcpy(p, version_str, version_str_len);
    p += version_str_len;
    *p++ = '\r';
    *p++ = '\n';
    *p++ = '\0';

    http_req->ver = version;
    http_req->method = method;

    return http_req->flags.start_line = true;
}